

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

void P_NewChaseDir(AActor *actor)

{
  player_t *ppVar1;
  sector_t_conflict *psVar2;
  AWeapon *pAVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  AActor *pAVar7;
  line_t_conflict *line;
  AActor *pAVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  _func_int **deltax;
  PClass *deltay;
  FBlockLinesIterator it;
  double local_d8;
  double local_d0;
  FBoundingBox local_a8;
  DVector3 local_88;
  _func_int **local_68;
  PClass *pPStack_60;
  
  actor->strafecount = 0;
  if (((actor->flags5).Value & 0x80) == 0) {
    pAVar7 = (actor->target).field_0.p;
    if (pAVar7 == (AActor *)0x0) {
LAB_003efdac:
      pAVar7 = (AActor *)0x0;
    }
    else if (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (actor->target).field_0.p = (AActor *)0x0;
      goto LAB_003efdac;
    }
    pAVar8 = (actor->goal).field_0.p;
    if (pAVar8 == (AActor *)0x0) {
LAB_003efdcb:
      pAVar8 = (AActor *)0x0;
    }
    else if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (actor->goal).field_0.p = (AActor *)0x0;
      goto LAB_003efdcb;
    }
    if (pAVar8 == pAVar7) goto LAB_003efddb;
LAB_003efe08:
    pAVar8 = (actor->target).field_0.p;
    if (pAVar8 == (AActor *)0x0) {
LAB_003f0156:
      Printf("P_NewChaseDir: called with no target\n");
      P_RandomChaseDir(actor);
      return;
    }
    if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (actor->target).field_0.p = (AActor *)0x0;
      goto LAB_003f0156;
    }
    AActor::Vec2To((AActor *)&stack0xffffffffffffff98,actor);
    deltax = local_68;
    deltay = pPStack_60;
    if ((((actor->flags6).Value & 0x10) == 0) &&
       (((ppVar1 = ((actor->target).field_0.p)->player, ppVar1 != (player_t *)0x0 &&
         ((ppVar1->cheats & 0x400) != 0)) || (((actor->flags4).Value & 0x40000000) != 0)))) {
      deltax = (_func_int **)((ulong)local_68 ^ 0x8000000000000000);
      deltay = (PClass *)((ulong)pPStack_60 ^ 0x8000000000000000);
    }
  }
  else {
    pAVar8 = (actor->goal).field_0.p;
LAB_003efddb:
    if (pAVar8 == (AActor *)0x0) goto LAB_003efe08;
    if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (actor->goal).field_0.p = (AActor *)0x0;
      goto LAB_003efe08;
    }
    AActor::Vec2To((AActor *)&stack0xffffffffffffff98,actor);
    deltax = local_68;
    deltay = pPStack_60;
  }
  dVar10 = actor->floorz - actor->dropoffz;
  if (((actor->MaxDropOffHeight <= dVar10 && dVar10 != actor->MaxDropOffHeight) &&
      ((actor->__Pos).Z <= actor->floorz)) &&
     ((uVar6 = (actor->flags).Value, (uVar6 >> 10 & 1) == 0 &&
      (((uVar6 & 0x4000) == 0 && ((actor->flags2).Value & 0x800) == 0 &&
       ((i_compatflags._1_1_ & 0x40) == 0)))))) {
    dVar10 = actor->radius;
    local_a8.m_Box[2] = (actor->__Pos).X;
    local_a8.m_Box[1] = (actor->__Pos).Y;
    local_a8.m_Box[0] = local_a8.m_Box[1] + dVar10;
    local_a8.m_Box[3] = local_a8.m_Box[2] + dVar10;
    local_a8.m_Box[1] = local_a8.m_Box[1] - dVar10;
    local_a8.m_Box[2] = local_a8.m_Box[2] - dVar10;
    FBlockLinesIterator::FBlockLinesIterator
              ((FBlockLinesIterator *)&stack0xffffffffffffff98,&local_a8);
    line = FBlockLinesIterator::Next((FBlockLinesIterator *)&stack0xffffffffffffff98);
    local_d8 = 0.0;
    local_d0 = 0.0;
    if (line != (line_t_conflict *)0x0) {
      local_d0 = 0.0;
      local_d8 = 0.0;
      do {
        if (((((line->backsector != (sector_t_conflict *)0x0) && (local_a8.m_Box[2] < line->bbox[3])
              ) && (line->bbox[2] <= local_a8.m_Box[3] && local_a8.m_Box[3] != line->bbox[2])) &&
            ((line->bbox[1] <= local_a8.m_Box[0] && local_a8.m_Box[0] != line->bbox[1] &&
             (local_a8.m_Box[1] < line->bbox[0])))) &&
           (iVar5 = FBoundingBox::BoxOnLineSide(&local_a8,(line_t *)line), iVar5 == -1)) {
          psVar2 = line->frontsector;
          AActor::PosRelative(&local_88,actor,line);
          dVar11 = (local_88.Y * (psVar2->floorplane).normal.Y +
                   local_88.X * (psVar2->floorplane).normal.X + (psVar2->floorplane).D) *
                   (psVar2->floorplane).negiC;
          psVar2 = line->backsector;
          AActor::PosRelative(&local_88,actor,line);
          dVar9 = ((psVar2->floorplane).normal.Y * local_88.Y +
                  (psVar2->floorplane).D + (psVar2->floorplane).normal.X * local_88.X) *
                  (psVar2->floorplane).negiC;
          dVar10 = (actor->__Pos).Z;
          if (((dVar9 != dVar10) || (NAN(dVar9) || NAN(dVar10))) ||
             (dVar10 - actor->MaxDropOffHeight <= dVar11)) {
            if (((dVar11 != dVar10) || (NAN(dVar11) || NAN(dVar10))) ||
               (dVar10 - actor->MaxDropOffHeight <= dVar9)) goto LAB_003f0093;
            dVar10 = c_atan2((line->delta).Y,(line->delta).X);
            dVar10 = dVar10 * 57.29577951308232 + 180.0;
          }
          else {
            dVar10 = c_atan2((line->delta).Y,(line->delta).X);
            dVar10 = dVar10 * 57.29577951308232;
          }
          dVar10 = FFastTrig::sin(&fasttrig,dVar10 * 11930464.711111112 + 6755399441055744.0);
          local_d0 = local_d0 - dVar10 * 32.0;
          dVar10 = FFastTrig::cos(&fasttrig,dVar10 * 32.0);
          local_d8 = local_d8 + dVar10 * 32.0;
        }
LAB_003f0093:
        line = FBlockLinesIterator::Next((FBlockLinesIterator *)&stack0xffffffffffffff98);
      } while (line != (line_t_conflict *)0x0);
    }
    if (((local_d0 != 0.0) || (NAN(local_d0))) || ((local_d8 != 0.0 || (NAN(local_d8))))) {
      *(byte *)&(actor->flags5).Value = (byte)(actor->flags5).Value | 0x20;
      P_DoNewChaseDir(actor,local_d0,local_d8);
      *(byte *)&(actor->flags5).Value = (byte)(actor->flags5).Value & 0xdf;
      actor->movecount = 1;
      return;
    }
  }
  pAVar8 = (actor->target).field_0.p;
  if (pAVar8 == (AActor *)0x0) {
LAB_003f01d4:
    pAVar8 = (AActor *)0x0;
  }
  else if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (actor->target).field_0.p = (AActor *)0x0;
    goto LAB_003f01d4;
  }
  if ((pAVar8->health < 1) || (bVar4 = AActor::IsFriend(actor,pAVar8), bVar4)) goto LAB_003f02d8;
  pAVar7 = (actor->goal).field_0.p;
  if (pAVar7 == (AActor *)0x0) {
LAB_003f0228:
    pAVar7 = (AActor *)0x0;
  }
  else if (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (actor->goal).field_0.p = (AActor *)0x0;
    goto LAB_003f0228;
  }
  if ((pAVar8 != pAVar7) && (((actor->flags3).Value & 0x800000) != 0)) {
    dVar10 = AActor::Distance2D(actor,pAVar8,false);
    if (pAVar8->player == (player_t *)0x0) {
      if ((pAVar8->MissileState != (FState *)0x0) ||
         (dVar9 = pAVar8->meleerange + pAVar8->radius, dVar9 + dVar9 <= dVar10)) goto LAB_003f02d8;
    }
    else {
      pAVar3 = pAVar8->player->ReadyWeapon;
      if ((pAVar3 == (AWeapon *)0x0) ||
         ((192.0 <= dVar10 ||
          ((*(uint *)&(pAVar3->super_AStateProvider).super_AInventory.field_0x4fc & 0x8000) == 0))))
      goto LAB_003f02d8;
    }
    uVar6 = FRandom::GenRand32(&pr_enemystrafe);
    actor->strafecount = (ushort)uVar6 & 0xf;
    deltax = (_func_int **)((ulong)deltax ^ 0x8000000000000000);
    deltay = (PClass *)((ulong)deltay ^ 0x8000000000000000);
  }
LAB_003f02d8:
  P_DoNewChaseDir(actor,(double)deltax,(double)deltay);
  if (actor->strafecount != 0) {
    actor->movecount = actor->strafecount;
  }
  return;
}

Assistant:

void P_NewChaseDir(AActor * actor)
{
	DVector2 delta;

	actor->strafecount = 0;

	if ((actor->flags5&MF5_CHASEGOAL || actor->goal == actor->target) && actor->goal!=NULL)
	{
		delta = actor->Vec2To(actor->goal);
	}
	else if (actor->target != NULL)
	{
		delta = actor->Vec2To(actor->target);

		if (!(actor->flags6 & MF6_NOFEAR))
		{
			if ((actor->target->player != NULL && (actor->target->player->cheats & CF_FRIGHTENING)) || 
				(actor->flags4 & MF4_FRIGHTENED))
			{
				delta = -delta;
			}
		}
	}
	else
	{
		// Don't abort if this happens.
		Printf ("P_NewChaseDir: called with no target\n");
		P_RandomChaseDir(actor);
		return;
	}
	
	// Try to move away from a dropoff
	if (actor->floorz - actor->dropoffz > actor->MaxDropOffHeight && 
		actor->Z() <= actor->floorz && !(actor->flags & MF_DROPOFF) && 
		!(actor->flags2 & MF2_ONMOBJ) &&
		!(actor->flags & MF_FLOAT) && !(i_compatflags & COMPATF_DROPOFF))
	{
		FBoundingBox box(actor->X(), actor->Y(), actor->radius);
		FBlockLinesIterator it(box);
		line_t *line;

		double deltax = 0;
		double deltay = 0;
		while ((line = it.Next()))
		{
			if (line->backsector  && // Ignore one-sided linedefs
				box.inRange(line) &&
				box.BoxOnLineSide(line) == -1)
		    {
				double front = line->frontsector->floorplane.ZatPoint(actor->PosRelative(line));
				double back  = line->backsector->floorplane.ZatPoint(actor->PosRelative(line));
				DAngle angle;
		
				// The monster must contact one of the two floors,
				// and the other must be a tall dropoff.
				
				if (back == actor->Z() && front < actor->Z() - actor->MaxDropOffHeight)
				{
					angle = line->Delta().Angle();   // front side dropoff
				}
				else if (front == actor->Z() && back < actor->Z() - actor->MaxDropOffHeight)
				{
					angle = line->Delta().Angle() + 180.; // back side dropoff
				}
				else continue;
		
				// Move away from dropoff at a standard speed.
				// Multiple contacted linedefs are cumulative (e.g. hanging over corner)
				deltax -= 32 * angle.Sin();
				deltay += 32 * angle.Cos();
			}
		}

		if (deltax != 0 || deltay != 0) 
		{
			// [Graf Zahl] I have changed P_TryMove to only apply this logic when
			// being called from here. AVOIDINGDROPOFF activates the code that
			// allows monsters to move away from a dropoff. This is different from
			// MBF which requires unconditional use of the altered logic and therefore
			// forcing a massive change in the monster behavior to use this.

			// use different dropoff movement logic in P_TryMove
			actor->flags5|=MF5_AVOIDINGDROPOFF;
			P_DoNewChaseDir(actor, deltax, deltay);
			actor->flags5&=~MF5_AVOIDINGDROPOFF;
		
			// If moving away from dropoff, set movecount to 1 so that 
			// small steps are taken to get monster away from dropoff.
			actor->movecount = 1;
			return;
		}
	}

#if 0
	// Move away from friends when too close, except
	// in certain situations (e.g. a crowded lift)

	// MBF code for friends. Cannot be done in ZDoom but left here as a reminder for later implementation.

	if (actor->flags & target->flags & MF_FRIEND &&
	    distfriend > dist && 
	    !P_IsOnLift(target) && !P_IsUnderDamage(actor))
	  deltax = -deltax, deltay = -deltay;
	else
#endif

	// MBF's monster_backing option. Made an actor flag instead. Also cleaned the code up to make it readable.
	// Todo: implement the movement logic
	AActor *target = actor->target;
	if (target->health > 0 && !actor->IsFriend(target) && target != actor->goal)
    {   // Live enemy target

		if (actor->flags3 & MF3_AVOIDMELEE)
		{
			bool ismeleeattacker = false;
			double dist = actor->Distance2D(target);
			if (target->player == NULL)
			{
				ismeleeattacker = (target->MissileState == NULL && dist < (target->meleerange + target->radius)*2);
			}
			else if (target->player->ReadyWeapon != NULL)
			{
				// melee range of player weapon is a parameter of the action function and cannot be checked here.
				// Add a new weapon property?
				ismeleeattacker = ((target->player->ReadyWeapon->WeaponFlags & WIF_MELEEWEAPON) && dist < 192);
			}
			if (ismeleeattacker)
			{
				actor->strafecount = pr_enemystrafe() & 15;
				delta = -delta;
			}
	    }
	}

	P_DoNewChaseDir(actor, delta.X, delta.Y);

	// If strafing, set movecount to strafecount so that old Doom
	// logic still works the same, except in the strafing part

	if (actor->strafecount)
		actor->movecount = actor->strafecount;

}